

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::CopyPtrArray<aiLight>(aiLight ***dest,aiLight **src,ai_uint num)

{
  ulong uVar1;
  aiLight **ppaVar2;
  uint local_20;
  ai_uint i;
  ai_uint num_local;
  aiLight **src_local;
  aiLight ***dest_local;
  
  if (num == 0) {
    *dest = (aiLight **)0x0;
  }
  else {
    uVar1 = SUB168(ZEXT416(num) * ZEXT816(8),0);
    if (SUB168(ZEXT416(num) * ZEXT816(8),8) != 0) {
      uVar1 = 0xffffffffffffffff;
    }
    ppaVar2 = (aiLight **)operator_new__(uVar1);
    *dest = ppaVar2;
    for (local_20 = 0; local_20 < num; local_20 = local_20 + 1) {
      SceneCombiner::Copy(*dest + local_20,src[local_20]);
    }
  }
  return;
}

Assistant:

inline
void CopyPtrArray (Type**& dest, const Type* const * src, ai_uint num) {
    if (!num) {
        dest = NULL;
        return;
    }
    dest = new Type*[num];
    for (ai_uint i = 0; i < num;++i) {
        SceneCombiner::Copy(&dest[i],src[i]);
    }
}